

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

void testing::internal::XmlUnitTestResultPrinter::OutputXmlTestInfo
               (ostream *stream,char *test_case_name,TestInfo *test_info)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  undefined8 uVar2;
  _Alloc_hider _Var3;
  size_t sVar4;
  ostream *poVar5;
  TestPartResult *pTVar6;
  long *plVar7;
  int line;
  size_type *psVar8;
  TimeInMillis ms;
  long lVar9;
  int i;
  char *pcVar10;
  pointer pcVar11;
  int iVar12;
  string location;
  string message;
  undefined1 local_98 [32];
  undefined1 local_78 [32];
  string local_58;
  TestResult *local_38;
  
  std::__ostream_insert<char,std::char_traits<char>>(stream,"    <testcase name=\"",0x14);
  EscapeXml((XmlUnitTestResultPrinter *)local_98,(test_info->name_)._M_dataplus._M_p,true);
  uVar2 = local_98._0_8_;
  if ((_func_int **)local_98._0_8_ == (_func_int **)0x0) {
    std::ios::clear((int)stream + (int)*(undefined8 *)(*(long *)stream + -0x18));
  }
  else {
    sVar4 = strlen((char *)local_98._0_8_);
    std::__ostream_insert<char,std::char_traits<char>>(stream,(char *)uVar2,sVar4);
  }
  std::__ostream_insert<char,std::char_traits<char>>(stream,"\"",1);
  if ((_func_int **)local_98._0_8_ != (_func_int **)0x0) {
    operator_delete__((void *)local_98._0_8_);
  }
  pbVar1 = (test_info->value_param_).ptr_;
  if ((pbVar1 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
     ((pbVar1->_M_dataplus)._M_p != (pointer)0x0)) {
    std::__ostream_insert<char,std::char_traits<char>>(stream," value_param=\"",0xe);
    pbVar1 = (test_info->value_param_).ptr_;
    if (pbVar1 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar11 = (char *)0x0;
    }
    else {
      pcVar11 = (pbVar1->_M_dataplus)._M_p;
    }
    EscapeXml((XmlUnitTestResultPrinter *)local_98,pcVar11,true);
    uVar2 = local_98._0_8_;
    if ((_func_int **)local_98._0_8_ == (_func_int **)0x0) {
      std::__ostream_insert<char,std::char_traits<char>>(stream,"(null)",6);
    }
    else if ((char *)local_98._8_8_ != (char *)0x0) {
      pcVar10 = (char *)0x0;
      do {
        if (*(char *)(uVar2 + (long)pcVar10) == '\0') {
          std::__ostream_insert<char,std::char_traits<char>>(stream,"\\0",2);
        }
        else {
          local_58._M_dataplus._M_p._0_1_ = *(char *)(uVar2 + (long)pcVar10);
          std::__ostream_insert<char,std::char_traits<char>>(stream,(char *)&local_58,1);
        }
        pcVar10 = pcVar10 + 1;
      } while (pcVar10 != (char *)local_98._8_8_);
    }
    std::__ostream_insert<char,std::char_traits<char>>(stream,"\"",1);
    if ((_func_int **)local_98._0_8_ != (_func_int **)0x0) {
      operator_delete__((void *)local_98._0_8_);
    }
  }
  pbVar1 = (test_info->type_param_).ptr_;
  if ((pbVar1 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
     ((pbVar1->_M_dataplus)._M_p != (pointer)0x0)) {
    std::__ostream_insert<char,std::char_traits<char>>(stream," type_param=\"",0xd);
    pbVar1 = (test_info->type_param_).ptr_;
    if (pbVar1 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar11 = (char *)0x0;
    }
    else {
      pcVar11 = (pbVar1->_M_dataplus)._M_p;
    }
    EscapeXml((XmlUnitTestResultPrinter *)local_98,pcVar11,true);
    uVar2 = local_98._0_8_;
    if ((_func_int **)local_98._0_8_ == (_func_int **)0x0) {
      std::__ostream_insert<char,std::char_traits<char>>(stream,"(null)",6);
    }
    else if ((char *)local_98._8_8_ != (char *)0x0) {
      pcVar10 = (char *)0x0;
      do {
        if (*(char *)(uVar2 + (long)pcVar10) == '\0') {
          std::__ostream_insert<char,std::char_traits<char>>(stream,"\\0",2);
        }
        else {
          local_58._M_dataplus._M_p._0_1_ = *(char *)(uVar2 + (long)pcVar10);
          std::__ostream_insert<char,std::char_traits<char>>(stream,(char *)&local_58,1);
        }
        pcVar10 = pcVar10 + 1;
      } while (pcVar10 != (char *)local_98._8_8_);
    }
    std::__ostream_insert<char,std::char_traits<char>>(stream,"\"",1);
    if ((_func_int **)local_98._0_8_ != (_func_int **)0x0) {
      operator_delete__((void *)local_98._0_8_);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>(stream," status=\"",9);
  pcVar10 = "notrun";
  if ((ulong)test_info->should_run_ != 0) {
    pcVar10 = "run";
  }
  std::__ostream_insert<char,std::char_traits<char>>
            (stream,pcVar10,((ulong)test_info->should_run_ ^ 1) * 3 + 3);
  std::__ostream_insert<char,std::char_traits<char>>(stream,"\" time=\"",8);
  FormatTimeInMillisAsSeconds_abi_cxx11_
            ((string *)local_98,(internal *)(test_info->result_).elapsed_time_,ms);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (stream,(char *)local_98._0_8_,local_98._8_8_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\" classname=\"",0xd);
  EscapeXml((XmlUnitTestResultPrinter *)&local_58,test_case_name,true);
  _Var3._M_p = local_58._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    std::ios::clear((int)poVar5 + (int)*(undefined8 *)(*(long *)poVar5 + -0x18));
  }
  else {
    sVar4 = strlen(local_58._M_dataplus._M_p);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,_Var3._M_p,sVar4);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\"",1);
  local_38 = &test_info->result_;
  TestPropertiesAsXmlAttributes((XmlUnitTestResultPrinter *)local_78,local_38);
  uVar2 = local_78._0_8_;
  if ((_func_int **)local_78._0_8_ == (_func_int **)0x0) {
    std::ios::clear((int)poVar5 + (int)*(undefined8 *)(*(long *)poVar5 + -0x18));
  }
  else {
    sVar4 = strlen((char *)local_78._0_8_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)uVar2,sVar4);
  }
  if ((_func_int **)local_78._0_8_ != (_func_int **)0x0) {
    operator_delete__((void *)local_78._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    operator_delete__(local_58._M_dataplus._M_p);
  }
  if ((undefined1 *)local_98._0_8_ != local_98 + 0x10) {
    operator_delete((void *)local_98._0_8_);
  }
  if (0 < (int)((ulong)((long)(test_info->result_).test_part_results_.
                              super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(test_info->result_).test_part_results_.
                             super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 6)) {
    i = 0;
    iVar12 = 0;
    do {
      line = (int)test_info;
      pTVar6 = TestResult::GetTestPartResult(local_38,i);
      if (pTVar6->type_ != kSuccess) {
        if (iVar12 == 0) {
          std::__ostream_insert<char,std::char_traits<char>>(stream,">\n",2);
        }
        std::__ostream_insert<char,std::char_traits<char>>(stream,"      <failure message=\"",0x18);
        EscapeXml((XmlUnitTestResultPrinter *)local_98,(pTVar6->summary_).c_str_,true);
        uVar2 = local_98._0_8_;
        if ((_func_int **)local_98._0_8_ == (_func_int **)0x0) {
          std::ios::clear((int)stream + (int)*(undefined8 *)(*(long *)stream + -0x18));
        }
        else {
          sVar4 = strlen((char *)local_98._0_8_);
          std::__ostream_insert<char,std::char_traits<char>>(stream,(char *)uVar2,sVar4);
        }
        std::__ostream_insert<char,std::char_traits<char>>(stream,"\" type=\"\">",10);
        if ((_func_int **)local_98._0_8_ != (_func_int **)0x0) {
          operator_delete__((void *)local_98._0_8_);
        }
        FormatCompilerIndependentFileLocation_abi_cxx11_
                  ((string *)local_98,(internal *)(pTVar6->file_name_).c_str_,
                   (char *)(ulong)(uint)pTVar6->line_number_,line);
        local_78._0_8_ = local_78 + 0x10;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_78,local_98._0_8_,(char *)(local_98._8_8_ + local_98._0_8_));
        std::__cxx11::string::append((char *)local_78);
        plVar7 = (long *)std::__cxx11::string::append((char *)local_78);
        psVar8 = (size_type *)(plVar7 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar7 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar8) {
          local_58.field_2._M_allocated_capacity = *psVar8;
          local_58.field_2._8_8_ = plVar7[3];
          local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
        }
        else {
          local_58.field_2._M_allocated_capacity = *psVar8;
          local_58._M_dataplus._M_p = (pointer)*plVar7;
        }
        local_58._M_string_length = plVar7[1];
        *plVar7 = (long)psVar8;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        if ((undefined1 *)local_78._0_8_ != local_78 + 0x10) {
          operator_delete((void *)local_78._0_8_);
        }
        RemoveInvalidXmlCharacters((string *)local_78,&local_58);
        OutputXmlCDataSection(stream,(char *)local_78._0_8_);
        if ((undefined1 *)local_78._0_8_ != local_78 + 0x10) {
          operator_delete((void *)local_78._0_8_);
        }
        std::__ostream_insert<char,std::char_traits<char>>(stream,"</failure>\n",0xb);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != &local_58.field_2) {
          operator_delete(local_58._M_dataplus._M_p);
        }
        if ((undefined1 *)local_98._0_8_ != local_98 + 0x10) {
          operator_delete((void *)local_98._0_8_);
        }
        iVar12 = iVar12 + 1;
      }
      i = i + 1;
    } while (i < (int)((ulong)((long)(test_info->result_).test_part_results_.
                                     super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(test_info->result_).test_part_results_.
                                    super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>
                                    ._M_impl.super__Vector_impl_data._M_start) >> 6));
    if (iVar12 != 0) {
      pcVar10 = "    </testcase>\n";
      lVar9 = 0x10;
      goto LAB_001289fe;
    }
  }
  pcVar10 = " />\n";
  lVar9 = 4;
LAB_001289fe:
  std::__ostream_insert<char,std::char_traits<char>>(stream,pcVar10,lVar9);
  return;
}

Assistant:

void XmlUnitTestResultPrinter::OutputXmlTestInfo(::std::ostream* stream,
                                                 const char* test_case_name,
                                                 const TestInfo& test_info) {
  const TestResult& result = *test_info.result();
  *stream << "    <testcase name=\""
          << EscapeXmlAttribute(test_info.name()).c_str() << "\"";

  if (test_info.value_param() != NULL) {
    *stream << " value_param=\"" << EscapeXmlAttribute(test_info.value_param())
            << "\"";
  }
  if (test_info.type_param() != NULL) {
    *stream << " type_param=\"" << EscapeXmlAttribute(test_info.type_param())
            << "\"";
  }

  *stream << " status=\""
          << (test_info.should_run() ? "run" : "notrun")
          << "\" time=\""
          << FormatTimeInMillisAsSeconds(result.elapsed_time())
          << "\" classname=\"" << EscapeXmlAttribute(test_case_name).c_str()
          << "\"" << TestPropertiesAsXmlAttributes(result).c_str();

  int failures = 0;
  for (int i = 0; i < result.total_part_count(); ++i) {
    const TestPartResult& part = result.GetTestPartResult(i);
    if (part.failed()) {
      if (++failures == 1)
        *stream << ">\n";
      *stream << "      <failure message=\""
              << EscapeXmlAttribute(part.summary()).c_str()
              << "\" type=\"\">";
      const string location = internal::FormatCompilerIndependentFileLocation(
          part.file_name(), part.line_number());
      const string message = location + "\n" + part.message();
      OutputXmlCDataSection(stream,
                            RemoveInvalidXmlCharacters(message).c_str());
      *stream << "</failure>\n";
    }
  }

  if (failures == 0)
    *stream << " />\n";
  else
    *stream << "    </testcase>\n";
}